

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test::TestBody
          (CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena_00;
  string *psVar3;
  string *psVar4;
  char *pcVar5;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_1;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar;
  TestAllTypes *message2;
  Arena arena;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  allocator<char> local_389;
  string local_388;
  undefined1 local_368 [8];
  TestAllTypes message1;
  CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test *this_local;
  
  message1.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,1000,'a',&local_389);
  puVar2 = protobuf::internal::HasBits<2>::operator[]
                     ((HasBits<2> *)&message1.super_Message.super_MessageLite._internal_metadata_,0)
  ;
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena_00 = protobuf::MessageLite::GetArena((MessageLite *)local_368);
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message1.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,
             &local_388,arena_00);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,1000,'d',
             (allocator<char> *)((long)&arena.impl_.first_arena_.cached_blocks_ + 7));
  proto2_unittest::TestAllTypes::add_repeated_string<std::__cxx11::string>
            ((TestAllTypes *)local_368,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&arena.impl_.first_arena_.cached_blocks_ + 7));
  Arena::Arena((Arena *)&message2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Arena::Create<proto2_unittest::TestAllTypes,proto2_unittest::TestAllTypes&>
                   ((Arena *)&message2,(TestAllTypes *)local_368);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_
                     ((TestAllTypes *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  psVar4 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_((TestAllTypes *)local_368);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_488,"message2->optional_string()","message1.optional_string()",psVar3
             ,psVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  psVar3 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_
                     ((TestAllTypes *)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  psVar4 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_((TestAllTypes *)local_368,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_4a8,"message2->repeated_string(0)","message1.repeated_string(0)",
             psVar3,psVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  Arena::~Arena((Arena *)&message2);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_368);
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructorArenaLeakTest) {
  // Set possible leaking field types for TestAllTypes with values
  // guaranteed to not be inlined string or Cord values.
  // TestAllTypes has unconditional ArenaDtor registration.
  proto2_unittest::TestAllTypes message1;

  message1.set_optional_string(std::string(1000, 'a'));
  message1.add_repeated_string(std::string(1000, 'd'));

  Arena arena;
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena, message1);

  EXPECT_EQ(message2->optional_string(), message1.optional_string());
  EXPECT_EQ(message2->repeated_string(0), message1.repeated_string(0));
}